

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::EntryLocaleCompare(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  undefined8 uVar2;
  JavascriptString *scriptContext_00;
  bool bVar3;
  int iVar4;
  CallFlags e;
  charcount_t str1size;
  charcount_t str2size;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  JavascriptLibrary *pJVar8;
  EngineInterfaceObject *this;
  IntlEngineInterfaceExtensionObject *this_00;
  char16 *string1;
  char16 *string2;
  int result;
  int thatStrCount;
  char16 *pThatStr;
  int thisStrCount;
  char16 *pThisStr;
  undefined1 local_d0 [8];
  AutoReentrancyHandler autoReentrancyHandler_1;
  Arguments local_b0;
  undefined1 local_a0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  JavascriptFunction *func;
  IntlEngineInterfaceExtensionObject *intlExtensionObject;
  EngineInterfaceObject *nativeEngineInterfaceObj;
  JavascriptString *pThat;
  JavascriptString *pThis;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  Var local_10;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  iVar4 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar4);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x551,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pThis = (JavascriptString *)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x554,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)pThis,-0x7ff5ec3f,L"String.prototype.localeCompare");
  }
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x55a,"(args.Info.Count > 0)","Negative argument count");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  GetThisAndSearchStringArguments
            ((ArgumentReader *)&scriptContext,(ScriptContext *)pThis,
             L"String.prototype.localeCompare",&pThat,(JavascriptString **)&nativeEngineInterfaceObj
             ,true);
  if (((DAT_01ea4150 & 1) != 0) &&
     (bVar3 = ScriptContext::IsIntlEnabled((ScriptContext *)pThis), bVar3)) {
    pJVar8 = ScriptContext::GetLibrary((ScriptContext *)pThis);
    this = JavascriptLibraryBase::GetEngineInterfaceObject(&pJVar8->super_JavascriptLibraryBase);
    if (this != (EngineInterfaceObject *)0x0) {
      this_00 = (IntlEngineInterfaceExtensionObject *)
                EngineInterfaceObject::GetEngineExtension(this,EngineInterfaceExtensionKind_Intl);
      autoReentrancyHandler._8_8_ =
           IntlEngineInterfaceExtensionObject::GetStringLocaleCompare(this_00);
      if ((JavascriptFunction *)autoReentrancyHandler._8_8_ != (JavascriptFunction *)0x0) {
        pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)pThis);
        AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_a0,pTVar6);
        uVar2 = autoReentrancyHandler._8_8_;
        Arguments::Arguments(&local_b0,(Arguments *)&scriptContext);
        callInfo_local =
             (CallInfo)JavascriptFunction::CallFunction((JavascriptFunction *)uVar2,&local_b0);
        AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_a0);
        return (Var)callInfo_local;
      }
      pJVar8 = ScriptContext::GetLibrary((ScriptContext *)pThis);
      JavascriptLibrary::InitializeIntlForStringPrototype(pJVar8);
      autoReentrancyHandler._8_8_ =
           IntlEngineInterfaceExtensionObject::GetStringLocaleCompare(this_00);
      if ((JavascriptFunction *)autoReentrancyHandler._8_8_ != (JavascriptFunction *)0x0) {
        pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)pThis);
        AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_d0,pTVar6);
        uVar2 = autoReentrancyHandler._8_8_;
        Arguments::Arguments((Arguments *)&pThisStr,(Arguments *)&scriptContext);
        callInfo_local =
             (CallInfo)
             JavascriptFunction::CallFunction((JavascriptFunction *)uVar2,(Arguments *)&pThisStr);
        AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_d0);
        return (Var)callInfo_local;
      }
      autoReentrancyHandler.m_savedReentrancySafeOrHandled = false;
      autoReentrancyHandler._9_7_ = 0;
    }
  }
  string1 = GetString(pThat);
  str1size = GetLength(pThat);
  string2 = GetString((JavascriptString *)nativeEngineInterfaceObj);
  str2size = GetLength((JavascriptString *)nativeEngineInterfaceObj);
  iVar4 = PlatformAgnostic::UnicodeText::LogicalStringCompare(string1,str1size,string2,str2size);
  scriptContext_00 = pThis;
  if (iVar4 != -2) {
    bVar3 = TaggedInt::IsOverflow(iVar4);
    if (bVar3) {
      local_10 = JavascriptNumber::NewInlined((double)iVar4,(ScriptContext *)scriptContext_00);
    }
    else {
      local_10 = TaggedInt::ToVarUnchecked(iVar4);
    }
    return local_10;
  }
  pSVar5 = RecyclableObject::GetScriptContext(function);
  JavascriptError::ThrowRangeError(pSVar5,-0x7ff5ffcd,(PCWSTR)0x0);
}

Assistant:

Var JavascriptString::EntryLocaleCompare(RecyclableObject* function, CallInfo callInfo, ...)
    {
        using namespace PlatformAgnostic;

        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if(args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedString, _u("String.prototype.localeCompare"));
        }
        AssertMsg(args.Info.Count > 0, "Negative argument count");

        JavascriptString * pThis;
        JavascriptString * pThat;

        GetThisAndSearchStringArguments(args, scriptContext, _u("String.prototype.localeCompare"), &pThis, &pThat, true);

#ifdef ENABLE_INTL_OBJECT
        if (CONFIG_FLAG(IntlBuiltIns) && scriptContext->IsIntlEnabled())
        {
            EngineInterfaceObject* nativeEngineInterfaceObj = scriptContext->GetLibrary()->GetEngineInterfaceObject();
            if (nativeEngineInterfaceObj)
            {
                IntlEngineInterfaceExtensionObject* intlExtensionObject = static_cast<IntlEngineInterfaceExtensionObject*>(
                    nativeEngineInterfaceObj->GetEngineExtension(EngineInterfaceExtensionKind_Intl));

#ifdef INTL_WINGLOB
                if (args.Info.Count == 2)
                {
                    auto undefined = scriptContext->GetLibrary()->GetUndefined();
                    CallInfo toPass(callInfo.Flags, 3);
                    ThreadContext *threadContext = scriptContext->GetThreadContext();
                    return threadContext->ExecuteImplicitCall(function, ImplicitCall_Accessor,
                        [threadContext, intlExtensionObject, function, toPass, undefined, pThis, pThat]() -> Var
                        {
                            return CALL_ENTRYPOINT(threadContext, intlExtensionObject->EntryIntl_CompareString,
                                function, toPass, undefined, pThis, pThat);
                        }
                    );
                }
#endif

                // Check if String.prototype.localeCompare/Intl.Collator was already initialized
                JavascriptFunction* func = intlExtensionObject->GetStringLocaleCompare();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return func->CallFunction(args);
                    }
                    END_SAFE_REENTRANT_CALL
                }

                // String.prototype.localeCompare/Intl.Collator was not initialized yet, so we need to manually initialize it here
                scriptContext->GetLibrary()->InitializeIntlForStringPrototype();
                func = intlExtensionObject->GetStringLocaleCompare();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return func->CallFunction(args);
                    }
                    END_SAFE_REENTRANT_CALL
                }
            }
        }
#endif

        const char16* pThisStr = pThis->GetString();
        int thisStrCount = pThis->GetLength();

        const char16* pThatStr = pThat->GetString();
        int thatStrCount = pThat->GetLength();

        int result = UnicodeText::LogicalStringCompare(pThisStr, thisStrCount, pThatStr, thatStrCount);

        // LogicalStringCompare will return -2 if CompareStringEx fails.
        if (result == -2)
        {
            // TODO there is no spec on the error thrown here.
            // When the support for HR errors is implemented replace this with the same error reported by v5.8
            JavascriptError::ThrowRangeError(function->GetScriptContext(),
                VBSERR_InternalError /* TODO-ERROR: _u("Failed compare operation")*/ );
        }

        return JavascriptNumber::ToVar(result, scriptContext);
    }